

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsSpreadsheetReportLayout.cpp
# Opt level: O0

qreal __thiscall
KDReports::SpreadsheetReportLayout::paintTableVerticalHeader
          (SpreadsheetReportLayout *this,qreal x,qreal y,QPainter *painter,int row)

{
  qreal qVar1;
  qreal aheight;
  bool bVar2;
  int value;
  QColor QVar3;
  QColor local_194;
  Int local_184;
  undefined1 local_180 [8];
  QRectF cellContentsRect;
  QVariant decorationAlignment;
  QVariant cellDecoration;
  QFlag local_100;
  Alignment local_fc;
  qreal qStack_f8;
  Alignment alignment;
  qreal padding;
  undefined1 local_d0 [8];
  QString cellText;
  Spec local_b0;
  ushort uStack_ac;
  QVariant local_a8;
  undefined1 local_84 [8];
  QColor foreground;
  undefined1 local_68 [24];
  QRectF cellRect;
  QAbstractItemModel *model;
  int row_local;
  QPainter *painter_local;
  qreal y_local;
  qreal x_local;
  SpreadsheetReportLayout *this_local;
  
  cellRect.h = (qreal)(this->m_tableLayout).m_model;
  qVar1 = TableLayout::vHeaderWidth(&this->m_tableLayout);
  aheight = TableLayout::rowHeight(&this->m_tableLayout);
  QRectF::QRectF((QRectF *)(local_68 + 0x10),x,y,qVar1,aheight);
  TableLayout::verticalHeaderScaledFont((TableLayout *)local_68);
  QPainter::setFont((QFont *)painter);
  QFont::~QFont((QFont *)local_68);
  QPainter::fillRect((QRectF *)painter,(QBrush *)(local_68 + 0x10));
  drawBorder(this,(QRectF *)(local_68 + 0x10),painter);
  (**(code **)(*(long *)cellRect.h + 0xa0))(&local_a8,cellRect.h,row,2,9);
  QVar3 = qvariant_cast<QColor>(&local_a8);
  cellText.d.size = QVar3._0_8_;
  local_b0 = QVar3.ct._4_4_;
  foreground.cspec = local_b0;
  uStack_ac = QVar3.ct._8_2_;
  foreground.ct.argb.alpha = uStack_ac;
  local_84 = (undefined1  [8])cellText.d.size;
  QVariant::~QVariant(&local_a8);
  bVar2 = QColor::isValid((QColor *)local_84);
  if (bVar2) {
    QPainter::setPen((QColor *)painter);
  }
  (**(code **)(*(long *)cellRect.h + 0xa0))(&padding,cellRect.h,row,2,0);
  QVariant::toString();
  QVariant::~QVariant((QVariant *)&padding);
  qStack_f8 = TableLayout::scaledCellPadding(&this->m_tableLayout);
  (**(code **)(*(long *)cellRect.h + 0xa0))(&cellDecoration.d.field_0x18,cellRect.h,row,2,7);
  value = QVariant::toInt((bool *)&cellDecoration.d.field_0x18);
  QFlag::QFlag(&local_100,value);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_fc,local_100);
  QVariant::~QVariant((QVariant *)&cellDecoration.d.field_0x18);
  (**(code **)(*(long *)cellRect.h + 0xa0))(&decorationAlignment.d.field_0x18,cellRect.h,row,2,1);
  (**(code **)(*(long *)cellRect.h + 0xa0))(&cellContentsRect.h,cellRect.h,row,2,0x2d535fb1);
  QRectF::adjusted((QRectF *)local_180,(QRectF *)(local_68 + 0x10),qStack_f8,qStack_f8,-qStack_f8,
                   -qStack_f8);
  local_184 = local_fc.i;
  paintTextAndIcon(this,painter,(QRectF *)local_180,(QString *)local_d0,
                   (QVariant *)&decorationAlignment.d.field_0x18,(QVariant *)&cellContentsRect.h,
                   local_fc);
  bVar2 = QColor::isValid((QColor *)local_84);
  if (bVar2) {
    QColor::QColor(&local_194,black);
    QPainter::setPen((QColor *)painter);
  }
  qVar1 = QRectF::width((QRectF *)(local_68 + 0x10));
  QVariant::~QVariant((QVariant *)&cellContentsRect.h);
  QVariant::~QVariant((QVariant *)&decorationAlignment.d.field_0x18);
  QString::~QString((QString *)local_d0);
  return qVar1 + x;
}

Assistant:

qreal KDReports::SpreadsheetReportLayout::paintTableVerticalHeader(qreal x, qreal y, QPainter &painter, int row)
{
    QAbstractItemModel *model = m_tableLayout.m_model;

    const QRectF cellRect(x, y, m_tableLayout.vHeaderWidth(), m_tableLayout.rowHeight());

    painter.setFont(m_tableLayout.verticalHeaderScaledFont());
    painter.fillRect(cellRect, m_tableSettings.m_headerBackground);
    drawBorder(cellRect, painter);

    const QColor foreground = qvariant_cast<QColor>(model->headerData(row, Qt::Vertical, Qt::ForegroundRole));
    if (foreground.isValid())
        painter.setPen(foreground);

    const QString cellText = model->headerData(row, Qt::Vertical).toString();
    const qreal padding = m_tableLayout.scaledCellPadding();
    const Qt::Alignment alignment(model->headerData(row, Qt::Vertical, Qt::TextAlignmentRole).toInt());
    const QVariant cellDecoration = model->headerData(row, Qt::Vertical, Qt::DecorationRole);
    const QVariant decorationAlignment = model->headerData(row, Qt::Vertical, KDReports::AutoTableElement::DecorationAlignmentRole);

    const QRectF cellContentsRect = cellRect.adjusted(padding, padding, -padding, -padding);
    // painter.drawText( cellContentsRect, alignment, cellText );
    paintTextAndIcon(painter, cellContentsRect, cellText, cellDecoration, decorationAlignment, alignment);

    if (foreground.isValid())
        painter.setPen(Qt::black);

    x += cellRect.width();
    return x;
}